

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

void __thiscall
GoState<3u,3u>::
do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
          (GoState<3u,3u> *this,
          mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          *engine)

{
  result_type rVar1;
  vector<int,_std::allocator<int>_> moves;
  uniform_int_distribution<unsigned_long> move_ind;
  _Vector_base<int,_std::allocator<int>_> local_40;
  uniform_int_distribution<unsigned_long> local_28;
  
  (**(code **)(*(long *)this + 0x60))(&local_40,this);
  if (local_40._M_impl.super__Vector_impl_data._M_start !=
      local_40._M_impl.super__Vector_impl_data._M_finish) {
    local_28._M_param._M_b =
         ((long)local_40._M_impl.super__Vector_impl_data._M_finish -
          (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2) - 1;
    local_28._M_param._M_a = 0;
    rVar1 = std::uniform_int_distribution<unsigned_long>::operator()(&local_28,engine);
    (**(code **)(*(long *)this + 0x40))
              (this,local_40._M_impl.super__Vector_impl_data._M_start[rVar1]);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
    return;
  }
  MCTS::assertion_failed
            ("! moves.empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/go.h"
             ,0x124);
}

Assistant:

void do_random_move(RandomEngine* engine)
	{
		auto moves = get_moves();
		attest(! moves.empty());
		std::uniform_int_distribution<std::size_t> move_ind(0, moves.size() - 1);
		auto move = moves[move_ind(*engine)];
		do_move(move);
	}